

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

LPVOID GetNativeContextPC(native_context_t *context)

{
  native_context_t *context_local;
  
  return (LPVOID)(context->uc_mcontext).gregs[0x10];
}

Assistant:

LPVOID GetNativeContextPC(const native_context_t *context)
{
#ifdef _AMD64_
    return (LPVOID)MCREG_Rip(context->uc_mcontext);
#elif defined(_X86_)
    return (LPVOID) MCREG_Eip(context->uc_mcontext);
#elif defined(HOST_S390X)
    return (LPVOID) MCREG_PSWAddr(context->uc_mcontext);
#elif defined(HOST_POWERPC64)
    return (LPVOID) MCREG_Nip(context->uc_mcontext);
#else
    return (LPVOID) MCREG_Pc(context->uc_mcontext);
#endif
}